

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNsPtr xmlSearchNs(xmlDocPtr doc,xmlNodePtr node,xmlChar *nameSpace)

{
  xmlElementType xVar1;
  int iVar2;
  xmlNsPtr pxVar3;
  xmlChar *pxVar4;
  _xmlNode *p_Var5;
  
  if ((node != (xmlNodePtr)0x0) && (node->type != XML_NAMESPACE_DECL)) {
    p_Var5 = node;
    if ((nameSpace == (xmlChar *)0x0) || (iVar2 = xmlStrEqual(nameSpace,"xml"), iVar2 == 0)) {
      for (; p_Var5 != (xmlNodePtr)0x0; p_Var5 = p_Var5->parent) {
        xVar1 = p_Var5->type;
        if (xVar1 == XML_ELEMENT_NODE) {
          pxVar3 = (xmlNsPtr)&p_Var5->nsDef;
          while (pxVar3 = pxVar3->next, pxVar3 != (xmlNsPtr)0x0) {
            pxVar4 = pxVar3->prefix;
            if (nameSpace == (xmlChar *)0x0 && pxVar4 == (xmlChar *)0x0) {
              if (pxVar3->href != (xmlChar *)0x0) {
                return pxVar3;
              }
            }
            else if ((((nameSpace != (xmlChar *)0x0) && (pxVar4 != (xmlChar *)0x0)) &&
                     (pxVar3->href != (xmlChar *)0x0)) &&
                    (iVar2 = xmlStrEqual(pxVar4,nameSpace), iVar2 != 0)) {
              return pxVar3;
            }
          }
          if ((p_Var5 != node) && (pxVar3 = p_Var5->ns, pxVar3 != (xmlNsPtr)0x0)) {
            pxVar4 = pxVar3->prefix;
            if (nameSpace == (xmlChar *)0x0 && pxVar4 == (xmlChar *)0x0) {
              if (pxVar3->href != (xmlChar *)0x0) {
                return pxVar3;
              }
            }
            else if (((nameSpace != (xmlChar *)0x0) && (pxVar4 != (xmlChar *)0x0)) &&
                    ((pxVar3->href != (xmlChar *)0x0 &&
                     (iVar2 = xmlStrEqual(pxVar4,nameSpace), iVar2 != 0)))) {
              return pxVar3;
            }
          }
        }
        else {
          if (xVar1 - XML_ENTITY_REF_NODE < 2) {
            return (xmlNsPtr)0x0;
          }
          if (xVar1 == XML_ENTITY_DECL) {
            return (xmlNsPtr)0x0;
          }
        }
      }
    }
    else {
      if (doc != (xmlDocPtr)0x0) {
LAB_00180c47:
        if (doc->oldNs == (xmlNsPtr)0x0) {
          pxVar3 = xmlTreeEnsureXMLDecl(doc);
          return pxVar3;
        }
        return doc->oldNs;
      }
      if (node->type == XML_ELEMENT_NODE) {
        pxVar3 = (xmlNsPtr)(*xmlMalloc)(0x30);
        if (pxVar3 != (xmlNsPtr)0x0) {
          pxVar3->next = (_xmlNs *)0x0;
          *(undefined8 *)&pxVar3->type = 0;
          pxVar3->_private = (void *)0x0;
          pxVar3->context = (_xmlDoc *)0x0;
          pxVar3->href = (xmlChar *)0x0;
          pxVar3->prefix = (xmlChar *)0x0;
          pxVar3->type = XML_NAMESPACE_DECL;
          pxVar4 = xmlStrdup((xmlChar *)"http://www.w3.org/XML/1998/namespace");
          pxVar3->href = pxVar4;
          pxVar4 = xmlStrdup("xml");
          pxVar3->prefix = pxVar4;
          pxVar3->next = node->nsDef;
          node->nsDef = pxVar3;
          return pxVar3;
        }
        xmlTreeErrMemory("searching namespace");
      }
      else {
        doc = node->doc;
        if (doc != (_xmlDoc *)0x0) goto LAB_00180c47;
      }
    }
  }
  return (xmlNsPtr)0x0;
}

Assistant:

xmlNsPtr
xmlSearchNs(xmlDocPtr doc, xmlNodePtr node, const xmlChar *nameSpace) {

    xmlNsPtr cur;
    const xmlNode *orig = node;

    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL)) return(NULL);
    if ((nameSpace != NULL) &&
	(xmlStrEqual(nameSpace, (const xmlChar *)"xml"))) {
	if ((doc == NULL) && (node->type == XML_ELEMENT_NODE)) {
	    /*
	     * The XML-1.0 namespace is normally held on the root
	     * element. In this case exceptionally create it on the
	     * node element.
	     */
	    cur = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
	    if (cur == NULL) {
		xmlTreeErrMemory("searching namespace");
		return(NULL);
	    }
	    memset(cur, 0, sizeof(xmlNs));
	    cur->type = XML_LOCAL_NAMESPACE;
	    cur->href = xmlStrdup(XML_XML_NAMESPACE);
	    cur->prefix = xmlStrdup((const xmlChar *)"xml");
	    cur->next = node->nsDef;
	    node->nsDef = cur;
	    return(cur);
	}
	if (doc == NULL) {
	    doc = node->doc;
	    if (doc == NULL)
		return(NULL);
	}
	/*
	* Return the XML namespace declaration held by the doc.
	*/
	if (doc->oldNs == NULL)
	    return(xmlTreeEnsureXMLDecl(doc));
	else
	    return(doc->oldNs);
    }
    while (node != NULL) {
	if ((node->type == XML_ENTITY_REF_NODE) ||
	    (node->type == XML_ENTITY_NODE) ||
	    (node->type == XML_ENTITY_DECL))
	    return(NULL);
	if (node->type == XML_ELEMENT_NODE) {
	    cur = node->nsDef;
	    while (cur != NULL) {
		if ((cur->prefix == NULL) && (nameSpace == NULL) &&
		    (cur->href != NULL))
		    return(cur);
		if ((cur->prefix != NULL) && (nameSpace != NULL) &&
		    (cur->href != NULL) &&
		    (xmlStrEqual(cur->prefix, nameSpace)))
		    return(cur);
		cur = cur->next;
	    }
	    if (orig != node) {
	        cur = node->ns;
	        if (cur != NULL) {
		    if ((cur->prefix == NULL) && (nameSpace == NULL) &&
		        (cur->href != NULL))
		        return(cur);
		    if ((cur->prefix != NULL) && (nameSpace != NULL) &&
		        (cur->href != NULL) &&
		        (xmlStrEqual(cur->prefix, nameSpace)))
		        return(cur);
	        }
	    }
	}
	node = node->parent;
    }
    return(NULL);
}